

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_icdf<trng::cauchy_dist<float>>(cauchy_dist<float> *d)

{
  result_type_conflict1 x;
  pointer pfVar1;
  int i;
  int iVar2;
  pointer pfVar3;
  float fVar4;
  result_type_conflict1 rVar5;
  float local_f0;
  float eps;
  vector<float,_std::allocator<float>_> p_values;
  SourceLineInfo local_c8;
  StringRef local_b8;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_float_&,_const_float_&> local_60;
  
  eps = 3.0517578e-05;
  p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.macroName.m_start._0_4_ = 0.5;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>
            (&p_values,(float *)&catchAssertionHandler);
  for (iVar2 = 2; iVar2 != 0x18; iVar2 = iVar2 + 1) {
    fVar4 = powf(*p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,(float)iVar2);
    catchAssertionHandler.m_assertionInfo.macroName.m_start._0_4_ = fVar4 + 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&p_values,(float *)&catchAssertionHandler);
    fVar4 = powf(*p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,(float)iVar2);
    catchAssertionHandler.m_assertionInfo.macroName.m_start._0_4_ = 1.0 - fVar4;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>
              (&p_values,(float *)&catchAssertionHandler);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish);
  pfVar1 = p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pfVar3 = p_values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    x = *pfVar3;
    rVar5 = trng::cauchy_dist<float>::icdf(d,x);
    rVar5 = trng::cauchy_dist<float>::cdf(d,rVar5);
    fVar4 = ABS(rVar5 - x);
    if (3.0517578e-05 <= fVar4) {
      local_60.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
      local_60.super_ITransientExpression.m_isBinaryExpression = true;
      local_60.super_ITransientExpression.m_result = false;
      local_60.super_ITransientExpression._10_6_ = 0;
      local_c8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_c8.line = 0xa8;
      Catch::StringRef::StringRef(&local_b8,"std::abs(y - p) < eps");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_60,&local_c8,local_b8,Normal);
      local_c8.file = (char *)&local_f0;
      local_f0 = fVar4;
      Catch::ExprLhs<float_const&>::operator<(&local_60,(ExprLhs<float_const&> *)&local_c8,&eps);
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_60.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_60.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&p_values.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}